

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivySeq.c
# Opt level: O0

int Ivy_GraphToNetworkSeqCountSeq(Ivy_Man_t *p,Ivy_Obj_t *pRoot,Dec_Graph_t *pGraph,int NodeMax)

{
  bool bVar1;
  int iVar2;
  Dec_Node_t *pDVar3;
  Dec_Node_t *pDVar4;
  Dec_Node_t *pDVar5;
  Ivy_Obj_t *pIVar6;
  Ivy_Obj_t *p_00;
  Ivy_Obj_t *pIVar7;
  Ivy_Obj_t *pIVar8;
  int local_6c;
  int fCompl;
  int Counter;
  int k;
  int i;
  Ivy_Obj_t *pAnd1;
  Ivy_Obj_t *pAnd0;
  Ivy_Obj_t *pAnd;
  Dec_Node_t *pNode1;
  Dec_Node_t *pNode0;
  Dec_Node_t *pNode;
  int NodeMax_local;
  Dec_Graph_t *pGraph_local;
  Ivy_Obj_t *pRoot_local;
  Ivy_Man_t *p_local;
  
  iVar2 = Dec_GraphIsConst(pGraph);
  if ((iVar2 == 0) && (iVar2 = Dec_GraphIsVar(pGraph), iVar2 == 0)) {
    local_6c = 0;
    for (Counter = pGraph->nLeaves; Counter < pGraph->nSize; Counter = Counter + 1) {
      pDVar3 = Dec_GraphNode(pGraph,Counter);
      pDVar4 = Dec_GraphNode(pGraph,(uint)pDVar3->eEdge0 >> 1 & 0x3fffffff);
      pDVar5 = Dec_GraphNode(pGraph,(uint)pDVar3->eEdge1 >> 1 & 0x3fffffff);
      pAnd1 = (Ivy_Obj_t *)(pDVar4->field_2).pFunc;
      _k = (Ivy_Obj_t *)(pDVar5->field_2).pFunc;
      fCompl = 0;
      while( true ) {
        bVar1 = false;
        if (pAnd1 != (Ivy_Obj_t *)0x0) {
          bVar1 = fCompl < (int)(*(uint *)&pDVar3->field_0x10 >> 0x11 & 0x1f);
        }
        if (!bVar1) break;
        iVar2 = Ivy_IsComplement(pAnd1);
        pIVar6 = Ivy_Regular(pAnd1);
        pIVar6 = Ivy_ObjCreateGhost(p,pIVar6,(Ivy_Obj_t *)0x0,IVY_LATCH,IVY_INIT_DC);
        pAnd1 = Ivy_TableLookup(p,pIVar6);
        if (pAnd1 != (Ivy_Obj_t *)0x0) {
          pAnd1 = Ivy_NotCond(pAnd1,iVar2);
        }
        fCompl = fCompl + 1;
      }
      fCompl = 0;
      while( true ) {
        bVar1 = false;
        if (_k != (Ivy_Obj_t *)0x0) {
          bVar1 = fCompl < (int)(*(uint *)&pDVar3->field_0x10 >> 0x16 & 0x1f);
        }
        if (!bVar1) break;
        iVar2 = Ivy_IsComplement(_k);
        pIVar6 = Ivy_Regular(_k);
        pIVar6 = Ivy_ObjCreateGhost(p,pIVar6,(Ivy_Obj_t *)0x0,IVY_LATCH,IVY_INIT_DC);
        _k = Ivy_TableLookup(p,pIVar6);
        if (_k != (Ivy_Obj_t *)0x0) {
          _k = Ivy_NotCond(_k,iVar2);
        }
        fCompl = fCompl + 1;
      }
      if ((pAnd1 == (Ivy_Obj_t *)0x0) || (_k == (Ivy_Obj_t *)0x0)) {
        pAnd0 = (Ivy_Obj_t *)0x0;
      }
      else {
        pIVar6 = Ivy_NotCond(pAnd1,(uint)pDVar3->eEdge0 & 1);
        p_00 = Ivy_NotCond(_k,(uint)pDVar3->eEdge1 & 1);
        pIVar7 = Ivy_Regular(pIVar6);
        iVar2 = Ivy_ObjIsLatch(pIVar7);
        if (iVar2 != 0) {
          pIVar7 = Ivy_Regular(p_00);
          iVar2 = Ivy_ObjIsLatch(pIVar7);
          if (iVar2 != 0) {
            __assert_fail("!Ivy_ObjIsLatch(Ivy_Regular(pAnd0)) || !Ivy_ObjIsLatch(Ivy_Regular(pAnd1))"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivySeq.c"
                          ,0x1ba,
                          "int Ivy_GraphToNetworkSeqCountSeq(Ivy_Man_t *, Ivy_Obj_t *, Dec_Graph_t *, int)"
                         );
          }
        }
        pIVar7 = Ivy_Regular(pIVar6);
        pIVar8 = Ivy_Regular(p_00);
        if (pIVar7 == pIVar8) {
LAB_00a34096:
          pAnd0 = Ivy_And(p,pIVar6,p_00);
        }
        else {
          pIVar7 = Ivy_Regular(pIVar6);
          iVar2 = Ivy_ObjIsConst1(pIVar7);
          if (iVar2 != 0) goto LAB_00a34096;
          pIVar7 = Ivy_Regular(p_00);
          iVar2 = Ivy_ObjIsConst1(pIVar7);
          if (iVar2 != 0) goto LAB_00a34096;
          pIVar6 = Ivy_ObjCreateGhost(p,pIVar6,p_00,IVY_AND,IVY_INIT_NONE);
          pAnd0 = Ivy_TableLookup(p,pIVar6);
        }
        pIVar6 = Ivy_Regular(pAnd0);
        if (pIVar6 == pRoot) {
          return -1;
        }
      }
      if (pAnd0 == (Ivy_Obj_t *)0x0) {
LAB_00a34135:
        local_6c = local_6c + 1;
        if (NodeMax < local_6c) {
          return -1;
        }
      }
      else {
        pIVar6 = Ivy_Regular(pAnd0);
        iVar2 = Ivy_ObjIsTravIdCurrent(p,pIVar6);
        if (iVar2 != 0) goto LAB_00a34135;
      }
      (pDVar3->field_2).pFunc = pAnd0;
    }
    p_local._4_4_ = local_6c;
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Ivy_GraphToNetworkSeqCountSeq( Ivy_Man_t * p, Ivy_Obj_t * pRoot, Dec_Graph_t * pGraph, int NodeMax )
{
    Dec_Node_t * pNode, * pNode0, * pNode1;
    Ivy_Obj_t * pAnd, * pAnd0, * pAnd1;
    int i, k, Counter, fCompl;
    // check for constant function or a literal
    if ( Dec_GraphIsConst(pGraph) || Dec_GraphIsVar(pGraph) )
        return 0;
    // compute the AIG size after adding the internal nodes
    Counter = 0;
    Dec_GraphForEachNode( pGraph, pNode, i )
    {
        // get the children of this node
        pNode0 = Dec_GraphNode( pGraph, pNode->eEdge0.Node );
        pNode1 = Dec_GraphNode( pGraph, pNode->eEdge1.Node );
        // get the AIG nodes corresponding to the children 
        pAnd0 = (Ivy_Obj_t *)pNode0->pFunc; 
        pAnd1 = (Ivy_Obj_t *)pNode1->pFunc; 
        // skip the latches
        for ( k = 0; pAnd0 && k < (int)pNode->nLat0; k++ )
        {
            fCompl = Ivy_IsComplement(pAnd0);
            pAnd0 = Ivy_TableLookup( p, Ivy_ObjCreateGhost(p, Ivy_Regular(pAnd0), NULL, IVY_LATCH, IVY_INIT_DC) );
            if ( pAnd0 )
                pAnd0 = Ivy_NotCond( pAnd0, fCompl );
        }
        for ( k = 0; pAnd1 && k < (int)pNode->nLat1; k++ )
        {
            fCompl = Ivy_IsComplement(pAnd1);
            pAnd1 = Ivy_TableLookup( p, Ivy_ObjCreateGhost(p, Ivy_Regular(pAnd1), NULL, IVY_LATCH, IVY_INIT_DC) );
            if ( pAnd1 )
                pAnd1 = Ivy_NotCond( pAnd1, fCompl );
        }
        // get the new node
        if ( pAnd0 && pAnd1 )
        {
            // if they are both present, find the resulting node
            pAnd0 = Ivy_NotCond( pAnd0, pNode->eEdge0.fCompl );
            pAnd1 = Ivy_NotCond( pAnd1, pNode->eEdge1.fCompl );
            assert( !Ivy_ObjIsLatch(Ivy_Regular(pAnd0)) || !Ivy_ObjIsLatch(Ivy_Regular(pAnd1)) );
            if ( Ivy_Regular(pAnd0) == Ivy_Regular(pAnd1) || Ivy_ObjIsConst1(Ivy_Regular(pAnd0)) || Ivy_ObjIsConst1(Ivy_Regular(pAnd1)) )
                pAnd = Ivy_And( p, pAnd0, pAnd1 );
            else
                pAnd = Ivy_TableLookup( p, Ivy_ObjCreateGhost(p, pAnd0, pAnd1, IVY_AND, IVY_INIT_NONE) );
            // return -1 if the node is the same as the original root
            if ( Ivy_Regular(pAnd) == pRoot )
                return -1;
        }
        else
            pAnd = NULL;
        // count the number of added nodes
        if ( pAnd == NULL || Ivy_ObjIsTravIdCurrent(p, Ivy_Regular(pAnd)) )
        {
            if ( ++Counter > NodeMax )
                return -1;
        }
        pNode->pFunc = pAnd;
    }
    return Counter;
}